

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cpp
# Opt level: O0

size_t stackjit::TypeSystem::sizeOfType(Type *type)

{
  bool bVar1;
  uint uVar2;
  string *psVar3;
  string local_60 [39];
  PrimitiveTypes local_39;
  string local_38 [7];
  PrimitiveTypes primitiveType;
  string typeName;
  Type *type_local;
  
  psVar3 = Type::name_abi_cxx11_(type);
  std::__cxx11::string::string(local_38,(string *)psVar3);
  std::__cxx11::string::string(local_60,local_38);
  bVar1 = fromString((string *)local_60,&local_39);
  std::__cxx11::string::~string(local_60);
  if (bVar1) {
    type_local = (Type *)sizeOfType(local_39);
  }
  else {
    uVar2 = (*type->_vptr_Type[2])();
    if ((uVar2 & 1) == 0) {
      type_local = (Type *)0x0;
    }
    else {
      type_local = (Type *)0x8;
    }
  }
  std::__cxx11::string::~string(local_38);
  return (size_t)type_local;
}

Assistant:

std::size_t TypeSystem::sizeOfType(const Type* type) {
		auto typeName = type->name();
		PrimitiveTypes primitiveType;

		if (fromString(typeName, primitiveType)) {
			return sizeOfType(primitiveType);
		} else if (type->isReference()) {
			return sizeof(BytePtr);
		}

		return 0;
	}